

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_pHYs(ucvector *out,LodePNGInfo *info)

{
  uint uVar1;
  ucvector data;
  uint error;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  ucvector *in_stack_ffffffffffffffd0;
  uchar *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar2;
  
  uVar2 = 0;
  ucvector_init((ucvector *)&stack0xffffffffffffffd0);
  lodepng_add32bitInt(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  lodepng_add32bitInt(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  ucvector_push_back((ucvector *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),'\0')
  ;
  uVar1 = addChunk((ucvector *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0,
                   in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0);
  ucvector_cleanup((void *)0x10dc3b);
  return uVar1;
}

Assistant:

static unsigned addChunk_pHYs(ucvector* out, const LodePNGInfo* info)
{
  unsigned error = 0;
  ucvector data;
  ucvector_init(&data);

  lodepng_add32bitInt(&data, info->phys_x);
  lodepng_add32bitInt(&data, info->phys_y);
  ucvector_push_back(&data, info->phys_unit);

  error = addChunk(out, "pHYs", data.data, data.size);
  ucvector_cleanup(&data);

  return error;
}